

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::SearchPrefix(cmFindPackageCommand *this,string *prefix_in)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  cmFileList *pcVar4;
  ulong uVar5;
  bool bVar6;
  allocator<char> local_8b9;
  string local_8b8;
  cmFileListGeneratorCaseInsensitive local_898;
  cmFileListGeneratorProject local_868;
  cmFileListGeneratorEnumerate local_848;
  cmFileListGeneratorProject local_830;
  string local_810;
  cmFileListGeneratorFixed local_7f0;
  undefined1 local_7c0 [8];
  cmFindPackageFileList lister_8;
  cmFileListGeneratorEnumerate local_778;
  cmFileListGeneratorProject local_760;
  string local_740;
  cmFileListGeneratorFixed local_720;
  undefined1 local_6f0 [8];
  cmFindPackageFileList lister_7;
  allocator<char> local_6a1;
  string local_6a0;
  cmFileListGeneratorFixed local_680;
  cmFileListGeneratorEnumerate local_650;
  cmFileListGeneratorProject local_638;
  string local_618;
  cmFileListGeneratorFixed local_5f8;
  undefined1 local_5c8 [8];
  cmFindPackageFileList lister_6;
  string local_598;
  cmFileListGeneratorCaseInsensitive local_578;
  cmFileListGeneratorProject local_548;
  cmFileListGeneratorEnumerate local_528;
  string local_510;
  cmFileListGeneratorFixed local_4f0;
  undefined1 local_4c0 [8];
  cmFindPackageFileList lister_5;
  cmFileListGeneratorEnumerate local_478;
  string local_460;
  cmFileListGeneratorFixed local_440;
  undefined1 local_410 [8];
  cmFindPackageFileList lister_4;
  allocator<char> local_3c1;
  string local_3c0;
  cmFileListGeneratorFixed local_3a0;
  cmFileListGeneratorEnumerate local_370;
  string local_358;
  cmFileListGeneratorFixed local_338;
  undefined1 local_308 [8];
  cmFindPackageFileList lister_3;
  undefined1 local_2c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  common;
  string local_2a0;
  cmFileListGeneratorCaseInsensitive local_280;
  cmFileListGeneratorProject local_250;
  string local_230;
  cmFileListGeneratorFixed local_210;
  undefined1 local_1e0 [8];
  cmFindPackageFileList lister_2;
  string local_198;
  cmFileListGeneratorFixed local_178;
  undefined1 local_148 [8];
  cmFindPackageFileList lister_1;
  string local_118;
  cmFileListGeneratorCaseInsensitive local_f8;
  string local_c8;
  cmFileListGeneratorFixed local_a8;
  undefined1 local_68 [8];
  cmFindPackageFileList lister;
  string prefix;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar6 = false;
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    bVar6 = *pcVar2 == '/';
  }
  __stream = _stderr;
  if (bVar6) {
    if ((this->DebugMode & 1U) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"Checking prefix [%s]\n",uVar3);
    }
    bVar6 = cmsys::SystemTools::FileIsDirectory(prefix_in);
    if (bVar6) {
      bVar6 = SearchDirectory(this,prefix_in);
      if (bVar6) {
        this_local._7_1_ = 1;
      }
      else {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&lister.UseSuffixes,(ulong)prefix_in);
        cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_68,this,true);
        std::__cxx11::string::string((string *)&local_c8,(string *)&lister.UseSuffixes);
        cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_a8,&local_c8);
        pcVar4 = cmFileList::operator/
                           ((cmFileList *)local_68,&local_a8.super_cmFileListGeneratorBase);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"cmake",(allocator<char> *)&lister_1.field_0x27);
        cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive(&local_f8,&local_118)
        ;
        cmFileList::operator/(pcVar4,&local_f8.super_cmFileListGeneratorBase);
        cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&lister_1.field_0x27);
        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_68);
        if (lister_1.UseSuffixes) {
          this_local._7_1_ = 1;
        }
        lister_1._33_3_ = 0;
        cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_68);
        if (lister_1._32_4_ == 0) {
          cmFindPackageFileList::cmFindPackageFileList((cmFindPackageFileList *)local_148,this,true)
          ;
          std::__cxx11::string::string((string *)&local_198,(string *)&lister.UseSuffixes);
          cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_178,&local_198);
          pcVar4 = cmFileList::operator/
                             ((cmFileList *)local_148,&local_178.super_cmFileListGeneratorBase);
          cmFileListGeneratorProject::cmFileListGeneratorProject
                    ((cmFileListGeneratorProject *)&lister_2.UseSuffixes,&this->Names,
                     this->SortOrder,this->SortDirection);
          cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_2.UseSuffixes);
          cmFileListGeneratorProject::~cmFileListGeneratorProject
                    ((cmFileListGeneratorProject *)&lister_2.UseSuffixes);
          cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_148);
          if (lister_1.UseSuffixes) {
            this_local._7_1_ = 1;
          }
          lister_1._33_3_ = 0;
          cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_148);
          if (lister_1._32_4_ == 0) {
            cmFindPackageFileList::cmFindPackageFileList
                      ((cmFindPackageFileList *)local_1e0,this,true);
            std::__cxx11::string::string((string *)&local_230,(string *)&lister.UseSuffixes);
            cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_210,&local_230);
            pcVar4 = cmFileList::operator/
                               ((cmFileList *)local_1e0,&local_210.super_cmFileListGeneratorBase);
            cmFileListGeneratorProject::cmFileListGeneratorProject
                      (&local_250,&this->Names,this->SortOrder,this->SortDirection);
            pcVar4 = cmFileList::operator/(pcVar4,&local_250.super_cmFileListGeneratorBase);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a0,"cmake",
                       (allocator<char> *)
                       ((long)&common.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                      (&local_280,&local_2a0);
            cmFileList::operator/(pcVar4,&local_280.super_cmFileListGeneratorBase);
            cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive(&local_280);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&common.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_250);
            cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_210);
            std::__cxx11::string::~string((string *)&local_230);
            lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_1e0);
            if (lister_1.UseSuffixes) {
              this_local._7_1_ = 1;
            }
            lister_1._33_3_ = 0;
            cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_1e0);
            if (lister_1._32_4_ == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2c0);
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &lister_3.UseSuffixes,"lib/",&this->LibraryArchitecture);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2c0,(value_type *)&lister_3.UseSuffixes);
                std::__cxx11::string::~string((string *)&lister_3.UseSuffixes);
              }
              if ((this->UseLib32Paths & 1U) != 0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[6]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_2c0,(char (*) [6])"lib32");
              }
              if ((this->UseLib64Paths & 1U) != 0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[6]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_2c0,(char (*) [6])"lib64");
              }
              if ((this->UseLibx32Paths & 1U) != 0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[7]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_2c0,(char (*) [7])"libx32");
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[4]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_2c0,(char (*) [4])0x8aaee9);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[6]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_2c0,(char (*) [6])"share");
              cmFindPackageFileList::cmFindPackageFileList
                        ((cmFindPackageFileList *)local_308,this,true);
              std::__cxx11::string::string((string *)&local_358,(string *)&lister.UseSuffixes);
              cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_338,&local_358);
              pcVar4 = cmFileList::operator/
                                 ((cmFileList *)local_308,&local_338.super_cmFileListGeneratorBase);
              cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                        (&local_370,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2c0);
              pcVar4 = cmFileList::operator/(pcVar4,&local_370.super_cmFileListGeneratorBase);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3c0,"cmake",&local_3c1);
              cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_3a0,&local_3c0);
              pcVar4 = cmFileList::operator/(pcVar4,&local_3a0.super_cmFileListGeneratorBase);
              cmFileListGeneratorProject::cmFileListGeneratorProject
                        ((cmFileListGeneratorProject *)&lister_4.UseSuffixes,&this->Names,
                         this->SortOrder,this->SortDirection);
              cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_4.UseSuffixes);
              cmFileListGeneratorProject::~cmFileListGeneratorProject
                        ((cmFileListGeneratorProject *)&lister_4.UseSuffixes);
              cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_3a0);
              std::__cxx11::string::~string((string *)&local_3c0);
              std::allocator<char>::~allocator(&local_3c1);
              cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_370);
              cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_338);
              std::__cxx11::string::~string((string *)&local_358);
              lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_308);
              if (lister_1.UseSuffixes) {
                this_local._7_1_ = 1;
              }
              lister_1._33_3_ = 0;
              cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_308);
              if (lister_1._32_4_ == 0) {
                cmFindPackageFileList::cmFindPackageFileList
                          ((cmFindPackageFileList *)local_410,this,true);
                std::__cxx11::string::string((string *)&local_460,(string *)&lister.UseSuffixes);
                cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_440,&local_460);
                pcVar4 = cmFileList::operator/
                                   ((cmFileList *)local_410,&local_440.super_cmFileListGeneratorBase
                                   );
                cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                          (&local_478,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c0);
                pcVar4 = cmFileList::operator/(pcVar4,&local_478.super_cmFileListGeneratorBase);
                cmFileListGeneratorProject::cmFileListGeneratorProject
                          ((cmFileListGeneratorProject *)&lister_5.UseSuffixes,&this->Names,
                           this->SortOrder,this->SortDirection);
                cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_5.UseSuffixes);
                cmFileListGeneratorProject::~cmFileListGeneratorProject
                          ((cmFileListGeneratorProject *)&lister_5.UseSuffixes);
                cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_478);
                cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_440);
                std::__cxx11::string::~string((string *)&local_460);
                lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_410);
                if (lister_1.UseSuffixes) {
                  this_local._7_1_ = 1;
                }
                lister_1._33_3_ = 0;
                cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_410);
                if (lister_1._32_4_ == 0) {
                  cmFindPackageFileList::cmFindPackageFileList
                            ((cmFindPackageFileList *)local_4c0,this,true);
                  std::__cxx11::string::string((string *)&local_510,(string *)&lister.UseSuffixes);
                  cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_4f0,&local_510);
                  pcVar4 = cmFileList::operator/
                                     ((cmFileList *)local_4c0,
                                      &local_4f0.super_cmFileListGeneratorBase);
                  cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                            (&local_528,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2c0);
                  pcVar4 = cmFileList::operator/(pcVar4,&local_528.super_cmFileListGeneratorBase);
                  cmFileListGeneratorProject::cmFileListGeneratorProject
                            (&local_548,&this->Names,this->SortOrder,this->SortDirection);
                  pcVar4 = cmFileList::operator/(pcVar4,&local_548.super_cmFileListGeneratorBase);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_598,"cmake",(allocator<char> *)&lister_6.field_0x27);
                  cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                            (&local_578,&local_598);
                  cmFileList::operator/(pcVar4,&local_578.super_cmFileListGeneratorBase);
                  cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive
                            (&local_578);
                  std::__cxx11::string::~string((string *)&local_598);
                  std::allocator<char>::~allocator((allocator<char> *)&lister_6.field_0x27);
                  cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_548);
                  cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_528);
                  cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_4f0);
                  std::__cxx11::string::~string((string *)&local_510);
                  lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_4c0);
                  if (lister_1.UseSuffixes) {
                    this_local._7_1_ = 1;
                  }
                  lister_1._33_3_ = 0;
                  cmFindPackageFileList::~cmFindPackageFileList((cmFindPackageFileList *)local_4c0);
                  if (lister_1._32_4_ == 0) {
                    cmFindPackageFileList::cmFindPackageFileList
                              ((cmFindPackageFileList *)local_5c8,this,true);
                    std::__cxx11::string::string((string *)&local_618,(string *)&lister.UseSuffixes)
                    ;
                    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_5f8,&local_618);
                    pcVar4 = cmFileList::operator/
                                       ((cmFileList *)local_5c8,
                                        &local_5f8.super_cmFileListGeneratorBase);
                    cmFileListGeneratorProject::cmFileListGeneratorProject
                              (&local_638,&this->Names,this->SortOrder,this->SortDirection);
                    pcVar4 = cmFileList::operator/(pcVar4,&local_638.super_cmFileListGeneratorBase);
                    cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                              (&local_650,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2c0);
                    pcVar4 = cmFileList::operator/(pcVar4,&local_650.super_cmFileListGeneratorBase);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_6a0,"cmake",&local_6a1);
                    cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_680,&local_6a0);
                    pcVar4 = cmFileList::operator/(pcVar4,&local_680.super_cmFileListGeneratorBase);
                    cmFileListGeneratorProject::cmFileListGeneratorProject
                              ((cmFileListGeneratorProject *)&lister_7.UseSuffixes,&this->Names,
                               this->SortOrder,this->SortDirection);
                    cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_7.UseSuffixes);
                    cmFileListGeneratorProject::~cmFileListGeneratorProject
                              ((cmFileListGeneratorProject *)&lister_7.UseSuffixes);
                    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_680);
                    std::__cxx11::string::~string((string *)&local_6a0);
                    std::allocator<char>::~allocator(&local_6a1);
                    cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_650);
                    cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_638);
                    cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_5f8);
                    std::__cxx11::string::~string((string *)&local_618);
                    lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_5c8);
                    if (lister_1.UseSuffixes) {
                      this_local._7_1_ = 1;
                    }
                    lister_1._33_3_ = 0;
                    cmFindPackageFileList::~cmFindPackageFileList
                              ((cmFindPackageFileList *)local_5c8);
                    if (lister_1._32_4_ == 0) {
                      cmFindPackageFileList::cmFindPackageFileList
                                ((cmFindPackageFileList *)local_6f0,this,true);
                      std::__cxx11::string::string
                                ((string *)&local_740,(string *)&lister.UseSuffixes);
                      cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_720,&local_740);
                      pcVar4 = cmFileList::operator/
                                         ((cmFileList *)local_6f0,
                                          &local_720.super_cmFileListGeneratorBase);
                      cmFileListGeneratorProject::cmFileListGeneratorProject
                                (&local_760,&this->Names,this->SortOrder,this->SortDirection);
                      pcVar4 = cmFileList::operator/
                                         (pcVar4,&local_760.super_cmFileListGeneratorBase);
                      cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                                (&local_778,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_2c0);
                      pcVar4 = cmFileList::operator/
                                         (pcVar4,&local_778.super_cmFileListGeneratorBase);
                      cmFileListGeneratorProject::cmFileListGeneratorProject
                                ((cmFileListGeneratorProject *)&lister_8.UseSuffixes,&this->Names,
                                 this->SortOrder,this->SortDirection);
                      cmFileList::operator/(pcVar4,(cmFileListGeneratorBase *)&lister_8.UseSuffixes)
                      ;
                      cmFileListGeneratorProject::~cmFileListGeneratorProject
                                ((cmFileListGeneratorProject *)&lister_8.UseSuffixes);
                      cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_778);
                      cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_760);
                      cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_720);
                      std::__cxx11::string::~string((string *)&local_740);
                      lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_6f0);
                      if (lister_1.UseSuffixes) {
                        this_local._7_1_ = 1;
                      }
                      lister_1._33_3_ = 0;
                      cmFindPackageFileList::~cmFindPackageFileList
                                ((cmFindPackageFileList *)local_6f0);
                      if (lister_1._32_4_ == 0) {
                        cmFindPackageFileList::cmFindPackageFileList
                                  ((cmFindPackageFileList *)local_7c0,this,true);
                        std::__cxx11::string::string
                                  ((string *)&local_810,(string *)&lister.UseSuffixes);
                        cmFileListGeneratorFixed::cmFileListGeneratorFixed(&local_7f0,&local_810);
                        pcVar4 = cmFileList::operator/
                                           ((cmFileList *)local_7c0,
                                            &local_7f0.super_cmFileListGeneratorBase);
                        cmFileListGeneratorProject::cmFileListGeneratorProject
                                  (&local_830,&this->Names,this->SortOrder,this->SortDirection);
                        pcVar4 = cmFileList::operator/
                                           (pcVar4,&local_830.super_cmFileListGeneratorBase);
                        cmFileListGeneratorEnumerate::cmFileListGeneratorEnumerate
                                  (&local_848,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_2c0);
                        pcVar4 = cmFileList::operator/
                                           (pcVar4,&local_848.super_cmFileListGeneratorBase);
                        cmFileListGeneratorProject::cmFileListGeneratorProject
                                  (&local_868,&this->Names,this->SortOrder,this->SortDirection);
                        pcVar4 = cmFileList::operator/
                                           (pcVar4,&local_868.super_cmFileListGeneratorBase);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_8b8,"cmake",&local_8b9);
                        cmFileListGeneratorCaseInsensitive::cmFileListGeneratorCaseInsensitive
                                  (&local_898,&local_8b8);
                        cmFileList::operator/(pcVar4,&local_898.super_cmFileListGeneratorBase);
                        cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive
                                  (&local_898);
                        std::__cxx11::string::~string((string *)&local_8b8);
                        std::allocator<char>::~allocator(&local_8b9);
                        cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_868);
                        cmFileListGeneratorEnumerate::~cmFileListGeneratorEnumerate(&local_848);
                        cmFileListGeneratorProject::~cmFileListGeneratorProject(&local_830);
                        cmFileListGeneratorFixed::~cmFileListGeneratorFixed(&local_7f0);
                        std::__cxx11::string::~string((string *)&local_810);
                        lister_1.UseSuffixes = cmFileList::Search((cmFileList *)local_7c0);
                        if (lister_1.UseSuffixes) {
                          this_local._7_1_ = 1;
                        }
                        lister_1._33_3_ = 0;
                        cmFindPackageFileList::~cmFindPackageFileList
                                  ((cmFindPackageFileList *)local_7c0);
                        if (lister_1._32_4_ == 0) {
                          this_local._7_1_ = 0;
                          lister_1.UseSuffixes = true;
                          lister_1._33_3_ = 0;
                        }
                      }
                    }
                  }
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2c0);
            }
          }
        }
        std::__cxx11::string::~string((string *)&lister.UseSuffixes);
      }
    }
    else {
      this_local._7_1_ = 0;
    }
    return (bool)(this_local._7_1_ & 1);
  }
  __assert_fail("!prefix_in.empty() && prefix_in.back() == \'/\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFindPackageCommand.cxx"
                ,0x808,"bool cmFindPackageCommand::SearchPrefix(const std::string &)");
}

Assistant:

bool cmFindPackageCommand::SearchPrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in.back() == '/');
  if (this->DebugMode) {
    fprintf(stderr, "Checking prefix [%s]\n", prefix_in.c_str());
  }

  // Skip this if the prefix does not exist.
  if (!cmSystemTools::FileIsDirectory(prefix_in)) {
    return false;
  }

  //  PREFIX/ (useful on windows or in build trees)
  if (this->SearchDirectory(prefix_in)) {
    return true;
  }

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string prefix = prefix_in.substr(0, prefix_in.size() - 1);

  //  PREFIX/(cmake|CMake)/ (useful on windows or in build trees)
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(Foo|foo|FOO).*/(cmake|CMake)/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  // Construct list of common install locations (lib and share).
  std::vector<std::string> common;
  if (!this->LibraryArchitecture.empty()) {
    common.push_back("lib/" + this->LibraryArchitecture);
  }
  if (this->UseLib32Paths) {
    common.emplace_back("lib32");
  }
  if (this->UseLib64Paths) {
    common.emplace_back("lib64");
  }
  if (this->UseLibx32Paths) {
    common.emplace_back("libx32");
  }
  common.emplace_back("lib");
  common.emplace_back("share");

  //  PREFIX/(lib/ARCH|lib*|share)/cmake/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorFixed("cmake") /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  //  PREFIX/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/(cmake|CMake)/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib*|share)/cmake/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorFixed("cmake") /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection);
    if (lister.Search()) {
      return true;
    }
  }

  // PREFIX/(Foo|foo|FOO).*/(lib/ARCH|lib*|share)/(Foo|foo|FOO).*/(cmake|CMake)/
  {
    cmFindPackageFileList lister(this);
    lister / cmFileListGeneratorFixed(prefix) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorEnumerate(common) /
      cmFileListGeneratorProject(this->Names, this->SortOrder,
                                 this->SortDirection) /
      cmFileListGeneratorCaseInsensitive("cmake");
    if (lister.Search()) {
      return true;
    }
  }

  return false;
}